

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O1

int main(void)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  CMUnitTest tests [19];
  CMUnitTest aCStack_308 [19];
  
  puVar1 = (uint *)cpuid_Version_info(1);
  uVar5 = (ulong)puVar1[3];
  uVar3 = *puVar1 >> 4;
  if (uVar3 < 0x406c) {
    if (uVar3 < 0x2065) {
      if (uVar3 < 0x266) {
        if (uVar3 < 0x6d) {
          uVar5 = (ulong)(uVar3 - 99);
          if (uVar3 - 99 < 2) {
            pcVar7 = "Prescott";
            goto LAB_00102c76;
          }
          if (uVar3 == 0x66) {
            pcVar7 = "Presler";
            goto LAB_00102c76;
          }
        }
        else {
          if (uVar3 == 0x6d) {
            pcVar7 = "Dothan";
            goto LAB_00102c76;
          }
          if (uVar3 == 0x6f) goto switchD_00102a23_caseD_0;
          if (uVar3 == 0x16c) {
            pcVar7 = "Pineview";
            goto LAB_00102c76;
          }
        }
      }
      else {
        uVar6 = (ulong)(uVar3 - 0x1066);
        if (uVar3 - 0x1066 < 9) {
          uVar5 = (long)&switchD_00102a23::switchdataD_00126010 +
                  (long)(int)(&switchD_00102a23::switchdataD_00126010)[uVar6];
          switch(uVar6) {
          case 0:
switchD_00102a23_caseD_0:
            pcVar7 = "Merom";
            goto LAB_00102c76;
          case 1:
          case 7:
            pcVar7 = "Penryn";
            goto LAB_00102c76;
          case 4:
          case 8:
switchD_00102a23_caseD_4:
            pcVar7 = "Nehalem";
            goto LAB_00102c76;
          }
        }
        else {
          uVar5 = uVar6;
          if (uVar3 == 0x266) {
            pcVar7 = "Lincroft";
            goto LAB_00102c76;
          }
          if (uVar3 == 0x366) {
            pcVar7 = "Cedarview";
            goto LAB_00102c76;
          }
        }
      }
    }
    else if (uVar3 < 0x306a) {
      uVar3 = uVar3 - 0x2065;
      if (uVar3 < 0xb) {
        uVar5 = 0x481;
        if ((0x481U >> (uVar3 & 0x1f) & 1) != 0) {
          pcVar7 = "Westmere";
          goto LAB_00102c76;
        }
        uVar5 = 0x120;
        if ((0x120U >> (uVar3 & 0x1f) & 1) != 0) {
          pcVar7 = "SandyBridge";
          goto LAB_00102c76;
        }
        if (uVar3 == 9) goto switchD_00102a23_caseD_4;
      }
    }
    else if (uVar3 < 0x306d) {
      if (uVar3 == 0x306a) {
        pcVar7 = "IvyBridge";
        goto LAB_00102c76;
      }
      if (uVar3 == 0x306c) {
        pcVar7 = "Haswell";
        goto LAB_00102c76;
      }
    }
    else {
      if (uVar3 == 0x306d) {
        pcVar7 = "Broadwell";
        goto LAB_00102c76;
      }
      if (uVar3 == 0x30f1) goto LAB_00102c09;
    }
  }
  else if (uVar3 < 0x9067) {
    if (uVar3 < 0x706a) {
      if (uVar3 < 0x606a) {
        if (uVar3 == 0x406c) {
          pcVar7 = "CherryTrail";
          goto LAB_00102c76;
        }
        if (uVar3 == 0x506c) goto LAB_00102ba9;
        if (uVar3 == 0x506e) {
          pcVar7 = "Skylake";
          goto LAB_00102c76;
        }
      }
      else {
        if (uVar3 == 0x606a) {
LAB_00102bb5:
          pcVar7 = "Icelake";
          goto LAB_00102c76;
        }
        if ((uVar3 == 0x60f0) || (uVar3 == 0x60f8)) {
LAB_00102c09:
          pcVar7 = "Zen2";
          goto LAB_00102c76;
        }
      }
    }
    else if (uVar3 < 0x806c) {
      if (uVar3 == 0x706a) {
LAB_00102ba9:
        pcVar7 = "Goldmont";
        goto LAB_00102c76;
      }
      if (uVar3 == 0x706e) goto LAB_00102bb5;
      if (uVar3 == 0x70f1) goto LAB_00102c09;
    }
    else {
      uVar5 = (ulong)(uVar3 - 0x806c);
      if (uVar3 - 0x806c < 2) {
        pcVar7 = "TigerLake";
        goto LAB_00102c76;
      }
      if (uVar3 == 0x806e) {
LAB_00102c19:
        pcVar7 = "Kabylake";
        goto LAB_00102c76;
      }
    }
  }
  else if (uVar3 < 0xa067) {
    if (uVar3 < 0x90f0) {
      if ((uVar3 == 0x9067) || (uVar3 == 0x906a)) {
        pcVar7 = "Alderlake";
        goto LAB_00102c76;
      }
      if (uVar3 == 0x906e) goto LAB_00102c19;
    }
    else {
      uVar5 = (ulong)(uVar3 - 0xa065);
      if (uVar3 - 0xa065 < 2) {
        pcVar7 = "Cometlake";
        goto LAB_00102c76;
      }
      if (uVar3 == 0x90f0) goto LAB_00102c09;
    }
  }
  else if (uVar3 < 0x40f40) {
    if (uVar3 == 0xa067) {
      pcVar7 = "Rocketlake";
      goto LAB_00102c76;
    }
    if (uVar3 == 0xb067) {
      pcVar7 = "Raptorlake";
      goto LAB_00102c76;
    }
    if (uVar3 == 0x20f10) goto LAB_00102bc1;
  }
  else {
    if (uVar3 == 0x40f40) {
      pcVar7 = "Zen3+";
      goto LAB_00102c76;
    }
    if (uVar3 == 0x50f00) {
LAB_00102bc1:
      pcVar7 = "Zen3";
      goto LAB_00102c76;
    }
    if (uVar3 == 0x60f10) {
      pcVar7 = "Zen4";
      goto LAB_00102c76;
    }
  }
  pcVar7 = "unknown";
LAB_00102c76:
  printf("x64 processor:  %s\t",pcVar7,(ulong)puVar1[2],uVar5);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar2 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar2 + 0xc) != '@') {
    lVar2 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(undefined4 *)(lVar2 + 0xc),
           (ulong)*(uint *)(lVar2 + 8));
  }
  memcpy(aCStack_308,&PTR_anon_var_dwarf_ff_00135ae0,0x2f8);
  iVar4 = _cmocka_run_group_tests
                    ("tests",aCStack_308,0x13,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar4;
}

Assistant:

int main() {
    tellmeall();
#if CROARING_IS_BIG_ENDIAN
    printf("Big-endian IO unsupported.\n");
    return EXIT_SUCCESS;
#else
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(test_robust_deserialize1),
        cmocka_unit_test(test_robust_deserialize2),
        cmocka_unit_test(test_robust_deserialize3),
        cmocka_unit_test(test_robust_deserialize4),
        cmocka_unit_test(test_robust_deserialize5),
        cmocka_unit_test(test_robust_deserialize6),
        cmocka_unit_test(test_robust_deserialize7),
        cmocka_unit_test(deserialize_negative_container_count),
        cmocka_unit_test(deserialize_huge_container_count),
        cmocka_unit_test(deserialize_duplicate_keys),
        cmocka_unit_test(deserialize_unsorted_keys),
        cmocka_unit_test(deserialize_duplicate_array),
        cmocka_unit_test(deserialize_unsorted_array),
        cmocka_unit_test(deserialize_bitset_incorrect_cardinality),
        cmocka_unit_test(deserialize_run_container_empty),
        cmocka_unit_test(deserialize_run_container_should_combine),
        cmocka_unit_test(deserialize_run_container_overlap),
        cmocka_unit_test(deserialize_run_container_overflow),
        cmocka_unit_test(
            deserialize_run_container_incorrect_cardinality_still_allowed),
    };

    return cmocka_run_group_tests(tests, NULL, NULL);
#endif
}